

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O0

FAudio_ChannelPositionFlags FAudio_GetChannelPositionFlags(int32_t total_channels,int32_t channel)

{
  code *pcVar1;
  int iVar2;
  FAudio_ChannelPositionFlags FVar3;
  int in_ESI;
  undefined4 in_EDI;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  FAudio_ChannelPositionFlags local_4;
  
  switch(in_EDI) {
  case 1:
    local_4 = Position_Center;
    break;
  case 2:
    local_4 = Position_Right;
    if (in_ESI == 0) {
      local_4 = Position_Left;
    }
    break;
  default:
    do {
      iVar2 = SDL_ReportAssertion(&FAudio_GetChannelPositionFlags::sdl_assert_data_2,
                                  "FAudio_GetChannelPositionFlags",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudioFX_reverb.c"
                                  ,0x211);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      FVar3 = (*pcVar1)();
      return FVar3;
    }
LAB_00129d61:
    local_4 = Position_Left;
    break;
  case 4:
    switch(in_ESI) {
    case 0:
      local_4 = Position_Left;
      break;
    case 1:
      local_4 = Position_Right;
      break;
    case 2:
      local_4 = Position_Rear|Position_Left;
      break;
    case 3:
      local_4 = Position_Rear|Position_Right;
      break;
    default:
      do {
        iVar2 = SDL_ReportAssertion(&FAudio_GetChannelPositionFlags::sdl_assert_data,
                                    "FAudio_GetChannelPositionFlags",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudioFX_reverb.c"
                                    ,0x1fe);
      } while (iVar2 == 0);
      if (iVar2 == 1) {
        pcVar1 = (code *)swi(3);
        FVar3 = (*pcVar1)();
        return FVar3;
      }
      goto LAB_00129d61;
    }
    break;
  case 5:
    switch(in_ESI) {
    case 0:
      local_4 = Position_Left;
      break;
    case 1:
      local_4 = Position_Right;
      break;
    case 2:
      local_4 = Position_Center;
      break;
    case 3:
      local_4 = Position_Rear|Position_Left;
      break;
    case 4:
      local_4 = Position_Rear|Position_Right;
      break;
    default:
      do {
        iVar2 = SDL_ReportAssertion(&FAudio_GetChannelPositionFlags::sdl_assert_data_1,
                                    "FAudio_GetChannelPositionFlags",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudioFX_reverb.c"
                                    ,0x20e);
      } while (iVar2 == 0);
      if (iVar2 == 1) {
        pcVar1 = (code *)swi(3);
        FVar3 = (*pcVar1)();
        return FVar3;
      }
      goto LAB_00129d61;
    }
  }
  return local_4;
}

Assistant:

static FAudio_ChannelPositionFlags FAudio_GetChannelPositionFlags(int32_t total_channels, int32_t channel)
{
	switch (total_channels)
	{
		case 1:
			return Position_Center;

		case 2:
			return (channel == 0) ? Position_Left : Position_Right;

		case 4:
			switch (channel)
			{
				case 0:
					return Position_Left;
				case 1:
					return Position_Right;
				case 2:
					return Position_Left | Position_Rear;
				case 3:
					return Position_Right | Position_Rear;
			}
			FAudio_assert(0 && "Unsupported channel count");
			break;
		case 5:
			switch (channel)
			{
				case 0:
					return Position_Left;
				case 1:
					return Position_Right;
				case 2:
					return Position_Center;
				case 3:
					return Position_Left | Position_Rear;
				case 4:
					return Position_Right | Position_Rear;
			}
			FAudio_assert(0 && "Unsupported channel count");
			break;
		default:
			FAudio_assert(0 && "Unsupported channel count");
			break;
	}

	/* shouldn't happen, but default to left speaker */
	return Position_Left;
}